

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void add_sconv_object(archive *a,archive_string_conv *sc)

{
  archive_string_conv *local_20;
  archive_string_conv **psc;
  archive_string_conv *sc_local;
  archive *a_local;
  
  for (local_20 = (archive_string_conv *)&a->sconv; local_20->next != (archive_string_conv *)0x0;
      local_20 = local_20->next) {
  }
  local_20->next = sc;
  return;
}

Assistant:

static void
add_sconv_object(struct archive *a, struct archive_string_conv *sc)
{
	struct archive_string_conv **psc; 

	/* Add a new sconv to sconv list. */
	psc = &(a->sconv);
	while (*psc != NULL)
		psc = &((*psc)->next);
	*psc = sc;
}